

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.h
# Opt level: O3

void DistPointToLineSqr(double pt_x,double pt_y,double ln_x1,double ln_y1,double ln_x2,double ln_y2,
                       distToLineTy *outResults)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (ln_y2 - ln_y1) * (ln_y2 - ln_y1) + (ln_x2 - ln_x1) * (ln_x2 - ln_x1);
  outResults->len2 = dVar1;
  dVar3 = (ln_y1 - pt_y) * (ln_y1 - pt_y) + (ln_x1 - pt_x) * (ln_x1 - pt_x);
  dVar4 = (ln_y2 - pt_y) * (ln_y2 - pt_y) + (ln_x2 - pt_x) * (ln_x2 - pt_x);
  dVar2 = (dVar3 - dVar1) - dVar4;
  dVar1 = (dVar2 * dVar2) / (dVar1 * -4.0) + dVar4;
  outResults->dist2 = dVar1;
  outResults->leg1_len2 = dVar3 - dVar1;
  outResults->leg2_len2 = dVar4 - dVar1;
  return;
}

Assistant:

inline double DistPythSqr (double x1, double y1,
                           double x2, double y2)
{ return pyth2(x2-x1, y2-y1); }